

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O3

bool __thiscall
raft_functional_common::TestSm::isSame(TestSm *this,TestSm *with,bool check_precommit)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  buffer *pbVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  byte *pbVar7;
  byte *pbVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  pthread_mutex_t *__mutex;
  _Rb_tree_header *p_Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pthread_mutex_t *__mutex_00;
  _Base_ptr this_01;
  
  if (this < with) {
    __mutex_00 = (pthread_mutex_t *)&this->dataLock;
    iVar4 = pthread_mutex_lock(__mutex_00);
    if (iVar4 != 0) {
LAB_00118e7b:
      std::__throw_system_error(iVar4);
    }
    __mutex = (pthread_mutex_t *)&with->dataLock;
    iVar4 = pthread_mutex_lock(__mutex);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
  }
  else {
    __mutex_00 = (pthread_mutex_t *)&with->dataLock;
    iVar4 = pthread_mutex_lock(__mutex_00);
    if (iVar4 != 0) goto LAB_00118e7b;
    __mutex = (pthread_mutex_t *)&this->dataLock;
    iVar4 = pthread_mutex_lock(__mutex);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
  }
  pthread_mutex_unlock(__mutex);
  pthread_mutex_unlock(__mutex_00);
  if (check_precommit) {
    if ((this->preCommits)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
        (with->preCommits)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      return false;
    }
    p_Var9 = (this->preCommits)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var12 = &(this->preCommits)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 != p_Var12) {
      p_Var1 = &(with->preCommits)._M_t._M_impl.super__Rb_tree_header;
      do {
        p_Var11 = (with->preCommits)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        if (p_Var11 == (_Base_ptr)0x0) {
          return false;
        }
        uVar2 = *(ulong *)(p_Var9 + 1);
        p_Var10 = &p_Var1->_M_header;
        do {
          if (*(ulong *)(p_Var11 + 1) >= uVar2) {
            p_Var10 = p_Var11;
          }
          p_Var11 = (&p_Var11->_M_left)[*(ulong *)(p_Var11 + 1) < uVar2];
        } while (p_Var11 != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var10 == p_Var1) {
          return false;
        }
        if (uVar2 < ((_Rb_tree_header *)p_Var10)->_M_node_count) {
          return false;
        }
        p_Var11 = p_Var9[1]._M_parent;
        this_01 = p_Var9[1]._M_left;
        if (this_01 != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&this_01->_M_parent = *(int *)&this_01->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&this_01->_M_parent = *(int *)&this_01->_M_parent + 1;
          }
        }
        pbVar3 = *(buffer **)((long)p_Var10 + 0x28);
        this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)p_Var10 + 0x28 + 8);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        sVar5 = nuraft::buffer::size((buffer *)p_Var11);
        sVar6 = nuraft::buffer::size(pbVar3);
        if (sVar5 != sVar6) goto LAB_00118e50;
        nuraft::buffer::pos((buffer *)p_Var11,0);
        nuraft::buffer::pos(pbVar3,0);
        pbVar7 = nuraft::buffer::data((buffer *)p_Var11);
        pbVar8 = nuraft::buffer::data(pbVar3);
        sVar5 = nuraft::buffer::size((buffer *)p_Var11);
        iVar4 = bcmp(pbVar7,pbVar8,sVar5);
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (this_01 != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
        }
        if (iVar4 != 0) {
          return false;
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var12);
    }
  }
  if ((this->commits)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      (with->commits)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    return false;
  }
  p_Var9 = (this->commits)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var12 = &(this->commits)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 == p_Var12) {
    return true;
  }
  p_Var1 = &(with->commits)._M_t._M_impl.super__Rb_tree_header;
  while( true ) {
    p_Var11 = (with->commits)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var11 == (_Base_ptr)0x0) {
      return false;
    }
    uVar2 = *(ulong *)(p_Var9 + 1);
    p_Var10 = &p_Var1->_M_header;
    do {
      if (*(ulong *)(p_Var11 + 1) >= uVar2) {
        p_Var10 = p_Var11;
      }
      p_Var11 = (&p_Var11->_M_left)[*(ulong *)(p_Var11 + 1) < uVar2];
    } while (p_Var11 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var10 == p_Var1) {
      return false;
    }
    if (uVar2 < ((_Rb_tree_header *)p_Var10)->_M_node_count) {
      return false;
    }
    p_Var11 = p_Var9[1]._M_parent;
    this_01 = p_Var9[1]._M_left;
    if (this_01 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&this_01->_M_parent = *(int *)&this_01->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&this_01->_M_parent = *(int *)&this_01->_M_parent + 1;
      }
    }
    pbVar3 = *(buffer **)((long)p_Var10 + 0x28);
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)p_Var10 + 0x28 + 8);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    sVar5 = nuraft::buffer::size((buffer *)p_Var11);
    sVar6 = nuraft::buffer::size(pbVar3);
    if (sVar5 != sVar6) break;
    nuraft::buffer::pos((buffer *)p_Var11,0);
    nuraft::buffer::pos(pbVar3,0);
    pbVar7 = nuraft::buffer::data((buffer *)p_Var11);
    pbVar8 = nuraft::buffer::data(pbVar3);
    sVar5 = nuraft::buffer::size((buffer *)p_Var11);
    iVar4 = bcmp(pbVar7,pbVar8,sVar5);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (this_01 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
    if (iVar4 != 0) {
      return false;
    }
    p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    if ((_Rb_tree_header *)p_Var9 == p_Var12) {
      return true;
    }
  }
LAB_00118e50:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (this_01 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  return false;
}

Assistant:

bool isSame(const TestSm& with, bool check_precommit = false) {
        // NOTE:
        //   To avoid false alarm by TSAN (regarding lock order inversion),
        //   always grab lock of the smaller address one first.
        if (this < &with) {
            std::lock_guard<std::mutex> ll_mine(dataLock);
            std::lock_guard<std::mutex> ll_with(with.dataLock);
        } else {
            std::lock_guard<std::mutex> ll_with(with.dataLock);
            std::lock_guard<std::mutex> ll_mine(dataLock);
        }

        if (check_precommit) {
            if (preCommits.size() != with.preCommits.size()) return false;
            for (auto& e1: preCommits) {
                auto e2 = with.preCommits.find(e1.first);
                if (e2 == with.preCommits.end()) return false;

                ptr<buffer> e1_buf = e1.second;
                ptr<buffer> e2_buf = e2->second;
                if (e1_buf->size() != e2_buf->size()) return false;

                e1_buf->pos(0);
                e2_buf->pos(0);
                if ( memcmp( e1_buf->data(),
                             e2_buf->data(),
                             e1_buf->size() ) ) return false;
            }
        }

        if (commits.size() != with.commits.size()) return false;
        for (auto& e1: commits) {
            auto e2 = with.commits.find(e1.first);
            if (e2 == with.commits.end()) return false;

            ptr<buffer> e1_buf = e1.second;
            ptr<buffer> e2_buf = e2->second;
            if (e1_buf->size() != e2_buf->size()) return false;

            e1_buf->pos(0);
            e2_buf->pos(0);
            if ( memcmp( e1_buf->data(),
                         e2_buf->data(),
                         e1_buf->size() ) ) return false;
        }

        return true;
    }